

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O2

void __thiscall
MathML::AST::ConstantExpression::relationalBinaryOperation
          (ConstantExpression *this,ConstantExpression *result,ConstantExpression *rhs,Operator op)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _func_int *UNRECOVERED_JUMPTABLE;
  String *__rhs;
  ulong uVar3;
  bool bVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Error err;
  allocator<char> local_81;
  double local_80;
  String local_78;
  Error local_58;
  
  iVar1 = (*(this->super_INode)._vptr_INode[9])();
  if ((iVar1 == 0) || (iVar1 = (*(rhs->super_INode)._vptr_INode[9])(rhs), iVar1 == 0)) {
    if (this->mErrorHandler == (ErrorHandler *)0x0) goto LAB_0085495f;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"uninitilized operand(s)",&local_81);
    Error::Error(&local_58,ERR_INVALIDPARAMS,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_58);
LAB_00854955:
    Error::~Error(&local_58);
LAB_0085495f:
    (*(result->super_INode)._vptr_INode[6])(0,result);
    return;
  }
  iVar1 = (*(this->super_INode)._vptr_INode[9])(this);
  if ((iVar1 == 1) || (iVar1 = (*(rhs->super_INode)._vptr_INode[9])(rhs), iVar1 == 1)) {
    iVar1 = (*(this->super_INode)._vptr_INode[9])(this);
    iVar2 = (*(rhs->super_INode)._vptr_INode[9])(rhs);
    if (iVar1 != iVar2) {
      if (this->mErrorHandler == (ErrorHandler *)0x0) goto LAB_0085495f;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,
                 "not both operands of type boolean for binary comparison operation",&local_81);
      Error::Error(&local_58,ERR_INVALIDPARAMS,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_58);
      goto LAB_00854955;
    }
    if (op == NEQ) {
      iVar1 = (*(this->super_INode)._vptr_INode[0xb])(this);
      iVar2 = (*(rhs->super_INode)._vptr_INode[0xb])(rhs);
      uVar3 = (ulong)(CONCAT44(extraout_var_01,iVar1) != CONCAT44(extraout_var_02,iVar2));
    }
    else {
      if (op != EQ) {
        if (this->mErrorHandler == (ErrorHandler *)0x0) goto LAB_0085495f;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,
                   "boolean operand(s) not allowed for this kind of binary comparision operation",
                   &local_81);
        Error::Error(&local_58,ERR_INVALIDPARAMS,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_58);
        goto LAB_00854955;
      }
      iVar1 = (*(this->super_INode)._vptr_INode[0xb])(this);
      iVar2 = (*(rhs->super_INode)._vptr_INode[0xb])(rhs);
      uVar3 = (ulong)(CONCAT44(extraout_var,iVar1) == CONCAT44(extraout_var_00,iVar2));
    }
    goto LAB_00854acd;
  }
  (*(this->super_INode)._vptr_INode[10])(this);
  local_80 = extraout_XMM0_Qa;
  (*(rhs->super_INode)._vptr_INode[10])(rhs);
  switch(op) {
  case EQ:
    bVar4 = local_80 == extraout_XMM0_Qa_00;
    break;
  case NEQ:
    bVar4 = local_80 != extraout_XMM0_Qa_00;
    break;
  case LTE:
    bVar4 = extraout_XMM0_Qa_00 < local_80;
    goto LAB_00854a98;
  case GTE:
    bVar4 = local_80 < extraout_XMM0_Qa_00;
LAB_00854a98:
    uVar3 = (ulong)!bVar4;
LAB_00854acd:
    UNRECOVERED_JUMPTABLE = (result->super_INode)._vptr_INode[8];
    goto LAB_00854ad7;
  case LT:
    bVar4 = extraout_XMM0_Qa_00 < local_80;
    goto LAB_00854ac9;
  case GT:
    bVar4 = local_80 < extraout_XMM0_Qa_00;
LAB_00854ac9:
    uVar3 = (ulong)(!bVar4 && local_80 != extraout_XMM0_Qa_00);
    goto LAB_00854acd;
  default:
    if (this->mErrorHandler == (ErrorHandler *)0x0) goto LAB_0085495f;
    __rhs = BinaryComparisonExpression::operatorString_abi_cxx11_(op);
    std::operator+(&local_78,"invalid operator: ",__rhs);
    Error::Error(&local_58,ERR_INVALIDPARAMS,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_58);
    goto LAB_00854955;
  }
  uVar3 = (ulong)(-(uint)bVar4 & 1);
  UNRECOVERED_JUMPTABLE = (result->super_INode)._vptr_INode[8];
LAB_00854ad7:
  (*UNRECOVERED_JUMPTABLE)(result,uVar3);
  return;
}

Assistant:

void ConstantExpression::relationalBinaryOperation( ConstantExpression& result, const ConstantExpression& rhs, AST::BinaryComparisonExpression::Operator op ) const
        {
            if ( this->getType() == SCALAR_INVALID || rhs.getType() == SCALAR_INVALID )
            {
                if ( mErrorHandler )
                {
                    Error err( Error::ERR_INVALIDPARAMS, "uninitilized operand(s)" );
                    mErrorHandler->handleError( &err );
                }
                result.setValue( 0. );
                return;
            }

            else if ( this->getType() == SCALAR_BOOL || rhs.getType() == SCALAR_BOOL )
            {
                //check if both bool

                if ( this->getType() != rhs.getType() )
                {
                    if ( mErrorHandler )
                    {
                        Error err( Error::ERR_INVALIDPARAMS, "not both operands of type boolean for binary comparison operation" );
                        mErrorHandler->handleError( &err );
                    }
                    result.setValue( 0. );
                    return;
                }

                // valid ==
                if ( op == AST::BinaryComparisonExpression::EQ )
                {
                    result.setValue( this->getLongValue() == rhs.getLongValue() );
                    return ;
                }

                // valid !=
                else if ( op == AST::BinaryComparisonExpression::NEQ )
                {
                    result.setValue( this->getLongValue() != rhs.getLongValue() );
                    return ;
                }

                //invalid: <, <=, >, ..
                if ( mErrorHandler )
                {
                    Error err( Error::ERR_INVALIDPARAMS, "boolean operand(s) not allowed for this kind of binary comparision operation" );
                    mErrorHandler->handleError( &err );
                }
                result.setValue( 0. );
                return;
            }

            //only double or long values
            else
            {
                double val1 = this->getDoubleValue();
                double val2 = rhs.getDoubleValue();

                switch ( op )
                {

                case AST::BinaryComparisonExpression::EQ:
                    result.setValue( val1 == val2 );
                    return ;

                case AST::BinaryComparisonExpression::NEQ:
                    result.setValue( val1 != val2 );
                    return ;

                case AST::BinaryComparisonExpression::LT:
                    result.setValue( val1 < val2 );
                    return ;

                case AST::BinaryComparisonExpression::LTE:
                    result.setValue( val1 <= val2 );
                    return ;

                case AST::BinaryComparisonExpression::GT:
                    result.setValue( val1 > val2 );
                    return ;

                case AST::BinaryComparisonExpression::GTE:
                    result.setValue( val1 >= val2 );
                    return ;

                default:
                    if ( mErrorHandler )
                    {
                        Error err( Error::ERR_INVALIDPARAMS, "invalid operator: " + AST::BinaryComparisonExpression::operatorString( op ) );
                        mErrorHandler->handleError( &err );
                    }
                    result.setValue( 0. );
                    return;
                }
            }
        }